

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O0

bool (anonymous_namespace)::SerializeDB<AutoFile,AddrMan>(AutoFile *stream,AddrMan *data)

{
  long lVar1;
  long in_FS_OFFSET;
  exception *e;
  HashedSourceWriter<AutoFile> hashwriter;
  CChainParams *in_stack_fffffffffffffea8;
  AutoFile *in_stack_fffffffffffffeb0;
  HashedSourceWriter<AutoFile> *in_stack_fffffffffffffeb8;
  HashWriter *in_stack_fffffffffffffec8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  HashedSourceWriter<AutoFile>::HashedSourceWriter
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  Params();
  CChainParams::MessageStart(in_stack_fffffffffffffea8);
  HashedSourceWriter<AutoFile>::operator<<
            (in_stack_fffffffffffffeb8,(array<unsigned_char,_4UL> *)in_stack_fffffffffffffeb0);
  HashedSourceWriter<AutoFile>::operator<<
            (in_stack_fffffffffffffeb8,(AddrMan *)in_stack_fffffffffffffeb0);
  HashWriter::GetHash(in_stack_fffffffffffffec8);
  AutoFile::operator<<((AutoFile *)in_stack_fffffffffffffeb8,(uint256 *)in_stack_fffffffffffffeb0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool SerializeDB(Stream& stream, const Data& data)
{
    // Write and commit header, data
    try {
        HashedSourceWriter hashwriter{stream};
        hashwriter << Params().MessageStart() << data;
        stream << hashwriter.GetHash();
    } catch (const std::exception& e) {
        LogError("%s: Serialize or I/O error - %s\n", __func__, e.what());
        return false;
    }

    return true;
}